

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCustomCommandGenerator.cxx
# Opt level: O2

string * __thiscall
cmCustomCommandGenerator::GetCommand_abi_cxx11_
          (string *__return_storage_ptr__,cmCustomCommandGenerator *this,uint c)

{
  char *__s;
  allocator<char> *__a;
  allocator<char> local_1a;
  allocator<char> local_19;
  
  __s = GetCrossCompilingEmulator(this,c);
  if (__s == (char *)0x0) {
    __s = GetArgv0Location(this,c);
    if (__s == (char *)0x0) {
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,
                 *(string **)
                  &(this->CommandLines).
                   super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                   super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                   _M_impl.super__Vector_impl_data._M_start[c].
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                );
      return __return_storage_ptr__;
    }
    __a = &local_1a;
  }
  else {
    __a = &local_19;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCustomCommandGenerator::GetCommand(unsigned int c) const
{
  if (const char* emulator = this->GetCrossCompilingEmulator(c)) {
    return std::string(emulator);
  }
  if (const char* location = this->GetArgv0Location(c)) {
    return std::string(location);
  }

  return this->CommandLines[c][0];
}